

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaExporter::ReadMaterialSurface
          (ColladaExporter *this,Surface *poSurface,aiMaterial *pSrcMat,aiTextureType pTexture,
          char *pKey,size_t pType,size_t pIndex)

{
  char *__s;
  char *pcVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  aiReturn aVar4;
  size_t sVar5;
  uint64_t uVar6;
  runtime_error *this_00;
  uint *max_inout;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  uint uvChannel;
  string index_str;
  aiString texfile;
  uint local_47c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  aiString local_434;
  
  uVar2 = aiGetMaterialTextureCount(pSrcMat,pTexture);
  if (uVar2 == 0) {
    if (pKey != (char *)0x0) {
      aVar4 = aiGetMaterialColor(pSrcMat,pKey,(uint)pType,(uint)pIndex,&poSurface->color);
      poSurface->exist = aVar4 == aiReturn_SUCCESS;
    }
  }
  else {
    __s = local_434.data;
    local_434.length = 0;
    local_434.data[0] = '\0';
    memset(local_434.data + 1,0x1b,0x3ff);
    local_47c = 0;
    aiGetMaterialTexture
              (pSrcMat,pTexture,0,&local_434,(aiTextureMapping *)0x0,&local_47c,(ai_real *)0x0,
               (aiTextureOp *)0x0,(aiTextureMapMode *)0x0,(uint *)0x0);
    local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,__s,local_434.data + sVar5)
    ;
    if ((local_458._M_string_length == 0) || (*local_458._M_dataplus._M_p != '*')) {
      pcVar1 = (char *)(poSurface->texture)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&poSurface->texture,0,pcVar1,(ulong)__s);
    }
    else {
      max_inout = (uint *)0xffffffffffffffff;
      std::__cxx11::string::substr((ulong)&local_478,(ulong)&local_458);
      std::__cxx11::string::operator=((string *)&local_458,(string *)&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      uVar6 = strtoul10_64((Assimp *)local_458._M_dataplus._M_p,(char *)0x0,(char **)0x0,max_inout);
      p_Var9 = &(this->textures)._M_t._M_impl.super__Rb_tree_header;
      _Var3 = (_Rb_tree_color)uVar6;
      p_Var8 = (this->textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var9->_M_header;
      for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar10]) {
        bVar10 = p_Var8[1]._M_color < _Var3;
        if (!bVar10) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = &p_Var9->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var9) && (p_Var8 = p_Var7, _Var3 < p_Var7[1]._M_color)) {
        p_Var8 = &p_Var9->_M_header;
      }
      if ((_Rb_tree_header *)p_Var8 == p_Var9) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_478,"could not find embedded texture at index ",&local_458);
        std::runtime_error::runtime_error(this_00,(string *)&local_478);
        *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::_M_assign((string *)&poSurface->texture);
    }
    poSurface->channel = (ulong)local_47c;
    poSurface->exist = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ColladaExporter::ReadMaterialSurface( Surface& poSurface, const aiMaterial* pSrcMat, 
                                          aiTextureType pTexture, const char* pKey, size_t pType, size_t pIndex) {
  if( pSrcMat->GetTextureCount( pTexture) > 0 ) {
    aiString texfile;
    unsigned int uvChannel = 0;
    pSrcMat->GetTexture( pTexture, 0, &texfile, NULL, &uvChannel);

    std::string index_str(texfile.C_Str());

    if(index_str.size() != 0 && index_str[0] == '*') {
        unsigned int index;

        index_str = index_str.substr(1, std::string::npos);

        try {
            index = (unsigned int) strtoul10_64(index_str.c_str());
        } catch(std::exception& error) {
            throw DeadlyExportError(error.what());
        }

        std::map<unsigned int, std::string>::const_iterator name = textures.find(index);

        if(name != textures.end()) {
            poSurface.texture = name->second;
        } else {
            throw DeadlyExportError("could not find embedded texture at index " + index_str);
        }
    } else {
        poSurface.texture = texfile.C_Str();
    }

    poSurface.channel = uvChannel;
    poSurface.exist = true;
  } else {
    if( pKey )
      poSurface.exist = pSrcMat->Get( pKey, static_cast<unsigned int>(pType), static_cast<unsigned int>(pIndex), poSurface.color) == aiReturn_SUCCESS;
  }
}